

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

string * __thiscall
units::getMultiplierString_abi_cxx11_
          (string *__return_storage_ptr__,units *this,double multiplier,bool numOnly)

{
  char cVar1;
  int iVar2;
  const_iterator cVar3;
  string *psVar4;
  __string_type rv;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  double local_198;
  float local_190 [4];
  long local_180;
  undefined8 local_178 [13];
  ios_base local_110 [264];
  
  if ((multiplier == 1.0) && (!NAN(multiplier))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return (string *)&__return_storage_ptr__->field_2;
  }
  local_198 = multiplier;
  if ((char)this == '\0') {
    local_190[0] = (float)multiplier;
    cVar3 = std::
            _Hashtable<float,_std::pair<const_float,_char>,_std::allocator<std::pair<const_float,_char>_>,_std::__detail::_Select1st,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<float,_std::pair<const_float,_char>,_std::allocator<std::pair<const_float,_char>_>,_std::__detail::_Select1st,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)si_prefixes,local_190);
    if (cVar3.super__Node_iterator_base<std::pair<const_float,_char>,_false>._M_cur !=
        (__node_type *)0x0) {
      cVar1 = *(char *)((long)cVar3.super__Node_iterator_base<std::pair<const_float,_char>,_false>.
                              _M_cur + 0xc);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = cVar1;
      __return_storage_ptr__->_M_string_length = 1;
      (__return_storage_ptr__->field_2)._M_local_buf[1] = '\0';
      return (string *)
             CONCAT71(cVar3.super__Node_iterator_base<std::pair<const_float,_char>,_false>._M_cur.
                      _1_7_,cVar1);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_190);
  *(undefined8 *)((long)local_178 + *(long *)(local_180 + -0x18)) = 0x12;
  std::ostream::_M_insert<double>(local_198);
  std::__cxx11::stringbuf::str();
  if (local_1b8._M_string_length < 5) {
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(&local_1b8,"inf");
    if (iVar2 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"1.00000000000000*(infinity)","");
      goto LAB_003e5e08;
    }
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(&local_1b8,"-inf");
    if (iVar2 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"1.00000000000000*(-1.00000000000000*infinity)",""
                );
      goto LAB_003e5e08;
    }
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(&local_1b8,"nan");
    if (iVar2 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"1.00000000000000*(nan)","");
      goto LAB_003e5e08;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p == &local_1b8.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,local_1b8.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_1b8.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1b8._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,local_1b8.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_1b8._M_string_length;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
LAB_003e5e08:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,
                    CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                             local_1b8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
  psVar4 = (string *)std::ios_base::~ios_base(local_110);
  return psVar4;
}

Assistant:

static std::string getMultiplierString(double multiplier, bool numOnly = false)
{
    if (multiplier == 1.0) {
        return {};
    }
    if (!numOnly) {
        auto si = si_prefixes.find(static_cast<float>(multiplier));
        if (si != si_prefixes.end()) {
            // NOLINTNEXTLINE(
            return std::string(1UL, si->second);
        }
    }
    int P = 18;  // the desired precision
    std::stringstream ss;

    ss << std::setprecision(P) << multiplier;
    auto rv = ss.str();
    if (rv.size() <= 4) {
        // modify some improper strings that cause issues later on
        // some platforms don't produce these
        if (rv == "inf") {
            return "1.00000000000000*(infinity)";  // LCOV_EXCL_LINE
        }
        if (rv == "-inf") {
            return "1.00000000000000*(-1.00000000000000*infinity)";  // LCOV_EXCL_LINE
        }
        if (rv == "nan") {
            return "1.00000000000000*(nan)";  // LCOV_EXCL_LINE
        }
    }
    return rv;
}